

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall
SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::ResetParse
          (Parse<SGParser::Generator::RegExprNFAParseElement> *this)

{
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_00;
  uint uVar1;
  ParseTable *pPVar2;
  RegExprNFAParseElement *pRVar3;
  size_t *psVar4;
  size_t *psVar5;
  size_t sVar6;
  
  pPVar2 = this->pParseTable;
  if ((pPVar2 == (ParseTable *)0x0) || (pPVar2->Type == None)) {
    psVar5 = (size_t *)0x0;
  }
  else {
    psVar5 = (size_t *)
             operator_new__(-(ulong)(pPVar2->ActionWidth >> 0x3d != 0) | pPVar2->ActionWidth << 3);
  }
  CleanupParseStack(this,0);
  this_00 = &this->Stream;
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ResetStream
            (this_00,this->pTokenizer,1);
  this->StackPosition = 0;
  sVar6 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex(this_00);
  this->PrevTokenIndex = sVar6;
  pPVar2 = this->pParseTable;
  if (((pPVar2 == (ParseTable *)0x0) ||
      (this->pTokenizer == (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0)) ||
     (pPVar2->Type == None)) {
    this->TopState = 0xffffffff;
    (this->pStack->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).State =
         0xffffffff;
  }
  else {
    uVar1 = pPVar2->InitialState;
    this->TopState = uVar1;
    pRVar3 = this->pStack;
    (pRVar3->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).State = uVar1;
    if ((ulong)uVar1 == 0xffffffff) {
      __assert_fail("TopState != InvalidState",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                    ,0x178,
                    "void SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::ResetParse()"
                   );
    }
    if (((byte)(pPVar2->StateInfos).
               super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar1] & 1) == 0) {
      (pRVar3->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).TerminalMarker =
           0xffffffffffffffff;
    }
    else {
      sVar6 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                        (this_00);
      (this->pStack->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).TerminalMarker
           = sVar6;
      BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker(this_00,sVar6);
    }
    psVar4 = this->pValidTokenStackPositions;
    this->pValidTokenStackPositions = psVar5;
    if (psVar4 != (size_t *)0x0) {
      operator_delete__(psVar4);
    }
  }
  this->NextTokenFlag = true;
  return;
}

Assistant:

void Parse<StackElement>::ResetParse() {
    // Token set might have been a different size so it must be reallocated
    // Basic exception safety is provided
    size_t* newValidTokenSet = pParseTable && pParseTable->IsValid()
                                   ? new size_t[pParseTable->GetTerminalCount()]
                                   : nullptr;

    // From this point we can (safely) change the existing data

    // Delete the parse stack
    CleanupParseStack();
    Stream.ResetStream(pTokenizer);

    // Reset the data
    StackPosition  = 0u;
    PrevTokenIndex = Stream.GetTokenIndex();

    // If the parse table and tokenizer are valid then reinitialize the data
    if (pParseTable && pTokenizer && pParseTable->IsValid()) {
        // Set the top and stack state to the initial parse table state
        TopState         = pParseTable->GetInitialState();
        pStack[0u].State = TopState;
        SG_ASSERT(TopState != InvalidState);

        // If the state is recording then initialize the terminal marker
        if (pParseTable->StateInfos[TopState].Record)
            Stream.SetMarker(pStack[0u].TerminalMarker = Stream.GetTokenIndex());
        else
            pStack[0u].TerminalMarker = InvalidIndex;

        delete[] std::exchange(pValidTokenStackPositions, newValidTokenSet);
    }
    // Otherwise, set them to empty
    else {
        TopState         = InvalidState;
        pStack[0u].State = InvalidState;
    }

    NextTokenFlag = true;
}